

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::lts_20240722::Cord::RemoveSuffix(Cord *this,size_t n)

{
  bool bVar1;
  size_t sVar2;
  Nullable<absl::cord_internal::CordRep_*> rep_00;
  Nullable<absl::cord_internal::CordzInfo_*> info;
  CordRepBtree *pCVar3;
  CordRep *pCVar4;
  bool local_1a4;
  CordRep *rep;
  CordzUpdateScope scope;
  Nullable<CordRep_*> pCStack_148;
  MethodIdentifier method;
  CordRep *tree;
  char *local_138;
  char *absl_raw_log_internal_filename;
  AlphaNum local_100;
  AlphaNum local_d0;
  AlphaNum local_a0;
  AlphaNum local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string death_message;
  size_t n_local;
  Cord *this_local;
  
  death_message.field_2._8_8_ = n;
  sVar2 = size(this);
  if (sVar2 < n) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,"Check n <= size() failed: ",&local_39);
    std::allocator<char>::~allocator(&local_39);
    AlphaNum::AlphaNum(&local_a0,"Requested suffix size ");
    AlphaNum::AlphaNum(&local_d0,death_message.field_2._8_8_);
    AlphaNum::AlphaNum(&local_100," exceeds Cord\'s size ");
    sVar2 = size(this);
    AlphaNum::AlphaNum((AlphaNum *)&absl_raw_log_internal_filename,sVar2);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_70,&local_a0,&local_d0,&local_100);
    std::__cxx11::string::operator+=((string *)local_38,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    local_138 = 
    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/strings/cord.cc"
    ;
    tree._4_4_ = 3;
    tree._0_4_ = 0x2c5;
    base_internal::
    AtomicHook<void(*)(absl::lts_20240722::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
    ::operator()((AtomicHook<void(*)(absl::lts_20240722::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
                  *)&raw_log_internal::internal_log_function_abi_cxx11_,
                 (LogSeverity *)((long)&tree + 4),&local_138,(int *)&tree,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2c5,"void absl::Cord::RemoveSuffix(size_t)");
  }
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  rep_00 = InlineRep::tree(&this->contents_);
  if (rep_00 == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    InlineRep::reduce_size(&this->contents_,death_message.field_2._8_8_);
  }
  else {
    scope.info_._4_4_ = 0x16;
    info = InlineRep::cordz_info(&this->contents_);
    cord_internal::CordzUpdateScope::CordzUpdateScope((CordzUpdateScope *)&rep,info,kRemoveSuffix);
    pCStack_148 = cord_internal::RemoveCrcNode(rep_00);
    if ((ulong)death_message.field_2._8_8_ < pCStack_148->length) {
      bVar1 = cord_internal::CordRep::IsBtree(pCStack_148);
      if (bVar1) {
        pCVar3 = cord_internal::CordRep::btree(pCStack_148);
        pCStack_148 = (Nullable<CordRep_*>)
                      absl::lts_20240722::cord_internal::CordRepBtree::RemoveSuffix
                                (pCVar3,death_message.field_2._8_8_);
      }
      else {
        bVar1 = cord_internal::CordRep::IsExternal(pCStack_148);
        if ((bVar1) ||
           (bVar1 = cord_internal::RefcountAndFlags::IsOne(&pCStack_148->refcount), !bVar1)) {
          pCVar4 = cord_internal::CordRepSubstring::Substring
                             (pCStack_148,0,pCStack_148->length - death_message.field_2._8_8_);
          cord_internal::CordRep::Unref(pCStack_148);
          pCStack_148 = pCVar4;
        }
        else {
          bVar1 = cord_internal::CordRep::IsFlat(pCStack_148);
          local_1a4 = true;
          if (!bVar1) {
            local_1a4 = cord_internal::CordRep::IsSubstring(pCStack_148);
          }
          if (local_1a4 == false) {
            __assert_fail("tree->IsFlat() || tree->IsSubstring()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/strings/cord.cc"
                          ,0x2d4,"void absl::Cord::RemoveSuffix(size_t)");
          }
          pCStack_148->length = pCStack_148->length - death_message.field_2._8_8_;
        }
      }
    }
    else {
      cord_internal::CordRep::Unref(pCStack_148);
      pCStack_148 = (Nullable<CordRep_*>)0x0;
    }
    InlineRep::SetTreeOrEmpty(&this->contents_,pCStack_148,(CordzUpdateScope *)&rep);
    cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&rep);
  }
  return;
}

Assistant:

void Cord::RemoveSuffix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested suffix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.reduce_size(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemoveSuffix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      tree = CordRepBtree::RemoveSuffix(tree->btree(), n);
    } else if (!tree->IsExternal() && tree->refcount.IsOne()) {
      assert(tree->IsFlat() || tree->IsSubstring());
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, 0, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}